

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall
opengv::math::Sturm::bracketRoots
          (Sturm *this,vector<double,_std::allocator<double>_> *roots,double eps)

{
  bool bVar1;
  Bracket *pBVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_t sVar5;
  Bracket *this_00;
  Bracket *in_RSI;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  size_t changes;
  iterator it;
  Ptr bracket;
  double localEps;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  stack;
  double absoluteBound;
  Bracket *in_stack_fffffffffffffeb8;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  *in_stack_fffffffffffffec0;
  Bracket *in_stack_fffffffffffffec8;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  Sturm *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  _Self in_stack_ffffffffffffff70;
  _List_iterator<std::shared_ptr<opengv::math::Bracket>_> local_78;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  local_70 [2];
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  local_38;
  double local_20;
  double local_18;
  Bracket *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_20 = computeLagrangianBound(in_stack_ffffffffffffff60);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::list((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)0x1301f2b);
  pBVar2 = (Bracket *)operator_new(0x30);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_20;
  Bracket::Bracket(pBVar2,-local_20,local_20);
  std::shared_ptr<opengv::math::Bracket>::shared_ptr<opengv::math::Bracket,void>
            ((shared_ptr<opengv::math::Bracket> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back(in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
  std::shared_ptr<opengv::math::Bracket>::~shared_ptr
            ((shared_ptr<opengv::math::Bracket> *)0x1301fa3);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back(in_stack_fffffffffffffec0);
  peVar3 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1301fc0);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back(in_stack_fffffffffffffec0);
  peVar4 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1301fdd);
  Bracket::lowerBound(peVar4);
  sVar5 = evaluateChain2((Sturm *)in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff68);
  Bracket::setLowerBoundChanges(peVar3,sVar5);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back(in_stack_fffffffffffffec0);
  peVar3 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x130202b);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back(in_stack_fffffffffffffec0);
  peVar4 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1302042);
  Bracket::upperBound(peVar4);
  sVar5 = evaluateChain2((Sturm *)in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff68);
  Bracket::setUpperBoundChanges(peVar3,sVar5);
  dVar6 = local_20;
  local_70[0].
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node._M_size = (size_t)local_18;
  if (local_18 < 0.0) {
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::back(in_stack_fffffffffffffec0);
    std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13020bc);
    sVar5 = Bracket::numberRoots(in_stack_fffffffffffffeb8);
    auVar8 = vcvtusi2sd_avx512f(auVar8,sVar5);
    local_70[0].
    super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ._M_impl._M_node._M_size = (size_t)(dVar6 / (auVar8._0_8_ * 10.0));
  }
  pBVar2 = local_10;
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back(in_stack_fffffffffffffec0);
  std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x130217e);
  this_00 = (Bracket *)Bracket::numberRoots(in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  while (bVar1 = std::__cxx11::
                 list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                 ::empty(&local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::front(in_stack_fffffffffffffec0);
    std::shared_ptr<opengv::math::Bracket>::shared_ptr
              ((shared_ptr<opengv::math::Bracket> *)in_stack_fffffffffffffec0,
               (shared_ptr<opengv::math::Bracket> *)in_stack_fffffffffffffeb8);
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::pop_front(in_stack_fffffffffffffec0);
    std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13021f3);
    bVar1 = Bracket::dividable(in_stack_fffffffffffffec8,(double)in_stack_fffffffffffffec0);
    if (bVar1) {
      std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1302224);
      Bracket::divide(this_00,(list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                               *)pBVar2);
      local_78._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
           ::end((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                  *)in_stack_fffffffffffffeb8);
      std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator--(&local_78,0);
      std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator*
                ((_List_iterator<std::shared_ptr<opengv::math::Bracket>_> *)0x1302271);
      peVar3 = std::
               __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1302279);
      Bracket::lowerBound(peVar3);
      sVar5 = evaluateChain2((Sturm *)in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff68);
      std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator*
                ((_List_iterator<std::shared_ptr<opengv::math::Bracket>_> *)0x13022af);
      peVar3 = std::
               __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13022b7);
      Bracket::setLowerBoundChanges(peVar3,sVar5);
      in_stack_ffffffffffffff70 =
           std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator--(&local_78,0);
      std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator*
                ((_List_iterator<std::shared_ptr<opengv::math::Bracket>_> *)0x13022eb);
      peVar3 = std::
               __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13022f3);
      Bracket::setUpperBoundChanges(peVar3,sVar5);
    }
    else {
      std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x130233b);
      sVar5 = Bracket::numberRoots(in_stack_fffffffffffffeb8);
      if (sVar5 != 0) {
        in_stack_fffffffffffffec0 = local_70;
        in_stack_fffffffffffffec8 = local_10;
        peVar3 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1302374);
        dVar6 = Bracket::lowerBound(peVar3);
        peVar3 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x130238c);
        dVar7 = Bracket::upperBound(peVar3);
        in_stack_ffffffffffffff68 = (dVar6 + dVar7) * 0.5;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0,
                   (value_type_conflict1 *)in_stack_fffffffffffffeb8);
      }
    }
    std::shared_ptr<opengv::math::Bracket>::~shared_ptr
              ((shared_ptr<opengv::math::Bracket> *)0x13023dc);
  }
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::~list((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
           *)0x13023ee);
  return;
}

Assistant:

void
opengv::math::Sturm::bracketRoots( std::vector<double> & roots, double eps )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  
  double localEps = eps;
  if( eps < 0.0 )
    localEps = absoluteBound / (10.0 * stack.back()->numberRoots());
  roots.reserve(stack.back()->numberRoots());
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable( localEps) )
    {
      bracket->divide(stack);
      std::list<Bracket::Ptr>::iterator it = stack.end();
      it--;
      size_t changes = evaluateChain2((*it)->lowerBound());
      (*it)->setLowerBoundChanges(changes);
      it--;
      (*it)->setUpperBoundChanges(changes);
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}